

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O1

bool mxx::
     is_sorted<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxDistribution_StableBlockDistr_Test::TestBody()::__0>
               (int *begin,int *end,long param_3)

{
  int *piVar1;
  pair<int,_int> pVar2;
  int *piVar3;
  bool bVar4;
  int result;
  int i;
  int local_54;
  comm local_50;
  
  piVar3 = end;
  if (begin != end) {
    piVar1 = begin + 2;
    do {
      piVar3 = piVar1;
      if (piVar3 == end) break;
      piVar1 = piVar3 + 2;
    } while (piVar3[-2] <= *piVar3);
  }
  bVar4 = piVar3 == end;
  if (*(int *)(param_3 + 0x10) != 1) {
    local_50._vptr_comm = (_func_int **)&PTR__comm_0015b108;
    local_50.mpi_comm = (MPI_Comm)&ompi_mpi_comm_world;
    MPI_Comm_size(&ompi_mpi_comm_world,&local_50.m_size);
    MPI_Comm_rank(local_50.mpi_comm,&local_50.m_rank);
    local_50.do_free = false;
    pVar2 = right_shift<std::pair<int,int>>((pair<int,_int> *)(end + -2),&local_50);
    comm::~comm(&local_50);
    bVar4 = *(int *)(param_3 + 0x14) < 1;
    if (piVar3 == end && !bVar4) {
      bVar4 = pVar2.first <= *begin;
    }
    else {
      bVar4 = piVar3 == end && bVar4;
    }
    local_50._vptr_comm = (_func_int **)CONCAT44(local_50._vptr_comm._4_4_,(uint)bVar4);
    MPI_Allreduce(&local_50,&local_54,1,&ompi_mpi_int,&ompi_mpi_op_land,*(undefined8 *)(param_3 + 8)
                 );
    bVar4 = local_54 != 0;
  }
  return bVar4;
}

Assistant:

bool is_sorted(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm = mxx::comm()) {
    return impl::is_sorted(begin, end, comp, comm);
}